

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall xmrig::Client::reconnect(Client *this)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar1;
  IClientListener *pIVar2;
  
  pIVar2 = (this->super_BaseClient).m_listener;
  if (pIVar2 != (IClientListener *)0x0) {
    this->m_keepAlive = 0;
    if ((this->super_BaseClient).m_failures == -1) {
      UNRECOVERED_JUMPTABLE = pIVar2->_vptr_IClientListener[2];
      lVar1 = -1;
    }
    else {
      setState(this,ReconnectingState);
      pIVar2 = (this->super_BaseClient).m_listener;
      lVar1 = (this->super_BaseClient).m_failures + 1;
      (this->super_BaseClient).m_failures = lVar1;
      UNRECOVERED_JUMPTABLE = pIVar2->_vptr_IClientListener[2];
    }
    (*UNRECOVERED_JUMPTABLE)(pIVar2,this,lVar1);
    return;
  }
  Storage<xmrig::Client>::remove((Storage<xmrig::Client> *)m_storage,(char *)this->m_key);
  return;
}

Assistant:

void xmrig::Client::reconnect()
{
    if (!m_listener) {
        m_storage.remove(m_key);

        return;
    }

    m_keepAlive = 0;

    if (m_failures == -1) {
        return m_listener->onClose(this, -1);
    }

    setState(ReconnectingState);

    m_failures++;
    m_listener->onClose(this, static_cast<int>(m_failures));
}